

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::http::add_to_watchdog(http *this)

{
  element_type *this_00;
  http_watchdog *in_RDI;
  shared_ptr<cppcms::impl::cgi::http> *__r;
  weak_http_ptr *p;
  http *in_stack_ffffffffffffffc8;
  shared_ptr<cppcms::impl::cgi::http> local_28;
  weak_http_ptr local_18;
  
  if ((in_RDI[5].field_0x5d & 1) == 0) {
    this_00 = std::
              __shared_ptr_access<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x49d301);
    __r = &local_28;
    self(in_stack_ffffffffffffffc8);
    p = &local_18;
    std::weak_ptr<cppcms::impl::cgi::http>::weak_ptr<cppcms::impl::cgi::http,void>
              ((weak_ptr<cppcms::impl::cgi::http> *)this_00,__r);
    http_watchdog::add(in_RDI,p);
    std::weak_ptr<cppcms::impl::cgi::http>::~weak_ptr((weak_ptr<cppcms::impl::cgi::http> *)0x49d347)
    ;
    std::shared_ptr<cppcms::impl::cgi::http>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::http> *)0x49d351);
    in_RDI[5].field_0x5d = 1;
  }
  return;
}

Assistant:

void add_to_watchdog()
		{
			if(!in_watchdog_) {
				watchdog_->add(self());
				in_watchdog_ = true;
			}
		}